

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddUtil.c
# Opt level: O3

DdGen * Cudd_zddFirstPath(DdManager *zdd,DdNode *f,int **path)

{
  DdNode *pDVar1;
  DdNode *pDVar2;
  undefined1 auVar3 [16];
  int iVar4;
  DdGen *__ptr;
  int *__ptr_00;
  DdNode **__s;
  long lVar5;
  long lVar6;
  DdNode *pDVar7;
  uint *puVar8;
  int iVar10;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  
  if (f != (DdNode *)0x0 && zdd != (DdManager *)0x0) {
    __ptr = (DdGen *)malloc(0x38);
    if (__ptr == (DdGen *)0x0) {
      zdd->errorCode = CUDD_MEMORY_OUT;
    }
    else {
      __ptr->manager = zdd;
      __ptr->type = 3;
      *(undefined1 (*) [16])&__ptr->status = (undefined1  [16])0x0;
      *(undefined8 *)((long)&(__ptr->gen).cubes.value + 4) = 0;
      *(undefined1 (*) [16])&(__ptr->stack).stack = (undefined1  [16])0x0;
      iVar4 = zdd->sizeZ;
      __ptr_00 = (int *)malloc((long)iVar4 * 4);
      (__ptr->gen).cubes.cube = __ptr_00;
      auVar3 = _DAT_0093d220;
      if (__ptr_00 == (int *)0x0) {
        zdd->errorCode = CUDD_MEMORY_OUT;
      }
      else {
        if (0 < iVar4) {
          lVar5 = (long)iVar4 + -1;
          auVar9._8_4_ = (int)lVar5;
          auVar9._0_8_ = lVar5;
          auVar9._12_4_ = (int)((ulong)lVar5 >> 0x20);
          lVar5 = 0;
          auVar9 = auVar9 ^ _DAT_0093d220;
          auVar11 = _DAT_0093e4e0;
          auVar12 = _DAT_0093d210;
          do {
            auVar13 = auVar12 ^ auVar3;
            iVar10 = auVar9._4_4_;
            if ((bool)(~(auVar13._4_4_ == iVar10 && auVar9._0_4_ < auVar13._0_4_ ||
                        iVar10 < auVar13._4_4_) & 1)) {
              *(undefined4 *)((long)__ptr_00 + lVar5) = 2;
            }
            if ((auVar13._12_4_ != auVar9._12_4_ || auVar13._8_4_ <= auVar9._8_4_) &&
                auVar13._12_4_ <= auVar9._12_4_) {
              *(undefined4 *)((long)__ptr_00 + lVar5 + 4) = 2;
            }
            auVar13 = auVar11 ^ auVar3;
            iVar14 = auVar13._4_4_;
            if (iVar14 <= iVar10 && (iVar14 != iVar10 || auVar13._0_4_ <= auVar9._0_4_)) {
              *(undefined4 *)((long)__ptr_00 + lVar5 + 8) = 2;
              *(undefined4 *)((long)__ptr_00 + lVar5 + 0xc) = 2;
            }
            lVar6 = auVar12._8_8_;
            auVar12._0_8_ = auVar12._0_8_ + 4;
            auVar12._8_8_ = lVar6 + 4;
            lVar6 = auVar11._8_8_;
            auVar11._0_8_ = auVar11._0_8_ + 4;
            auVar11._8_8_ = lVar6 + 4;
            lVar5 = lVar5 + 0x10;
          } while ((ulong)(iVar4 + 3U >> 2) << 4 != lVar5);
        }
        __s = (DdNode **)malloc((long)(int)(iVar4 + 1U) << 3);
        (__ptr->stack).stack = __s;
        if (__s != (DdNode **)0x0) {
          if (-1 < iVar4) {
            memset(__s,0,(ulong)(iVar4 + 1U) << 3);
          }
          *__s = f;
          iVar4 = 1;
          while( true ) {
            while( true ) {
              lVar5 = (long)iVar4;
              pDVar7 = (DdNode *)((ulong)__s[lVar5 + -1] & 0xfffffffffffffffe);
              if ((ulong)pDVar7->index == 0x7fffffff) break;
              __ptr_00[pDVar7->index] = 0;
              __s[lVar5] = (DdNode *)((ulong)(pDVar7->type).kids.E ^ 1);
              iVar4 = iVar4 + 1;
            }
            if (zdd->zero != pDVar7) break;
            if (iVar4 == 1) {
LAB_0092a87d:
              __ptr->status = 0;
              (__ptr->stack).sp = 0;
LAB_0092a885:
              *path = __ptr_00;
              return __ptr;
            }
            lVar6 = lVar5 + -1;
            pDVar7 = __s[lVar5 + -1];
            while( true ) {
              pDVar1 = __s[lVar6 + -1];
              puVar8 = (uint *)((ulong)pDVar1 & 0xfffffffffffffffe);
              pDVar2 = *(DdNode **)(puVar8 + 4);
              if (pDVar2 != pDVar7) break;
              __ptr_00[*puVar8] = 2;
              iVar4 = iVar4 + -1;
              lVar6 = lVar6 + -1;
              pDVar7 = pDVar1;
              if (lVar6 == 0) goto LAB_0092a87d;
            }
            __ptr_00[*puVar8] = 1;
            __s[lVar6] = pDVar2;
          }
          (__ptr->stack).sp = iVar4;
          __ptr->status = 1;
          (__ptr->gen).cubes.value = (pDVar7->type).value;
          goto LAB_0092a885;
        }
        zdd->errorCode = CUDD_MEMORY_OUT;
        free(__ptr_00);
      }
      free(__ptr);
    }
  }
  return (DdGen *)0x0;
}

Assistant:

DdGen *
Cudd_zddFirstPath(
  DdManager * zdd,
  DdNode * f,
  int ** path)
{
    DdGen *gen;
    DdNode *top, *next, *prev;
    int i;
    int nvars;

    /* Sanity Check. */
    if (zdd == NULL || f == NULL) return(NULL);

    /* Allocate generator an initialize it. */
    gen = ABC_ALLOC(DdGen,1);
    if (gen == NULL) {
        zdd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }

    gen->manager = zdd;
    gen->type = CUDD_GEN_ZDD_PATHS;
    gen->status = CUDD_GEN_EMPTY;
    gen->gen.cubes.cube = NULL;
    gen->gen.cubes.value = DD_ZERO_VAL;
    gen->stack.sp = 0;
    gen->stack.stack = NULL;
    gen->node = NULL;

    nvars = zdd->sizeZ;
    gen->gen.cubes.cube = ABC_ALLOC(int,nvars);
    if (gen->gen.cubes.cube == NULL) {
        zdd->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(gen);
        return(NULL);
    }
    for (i = 0; i < nvars; i++) gen->gen.cubes.cube[i] = 2;

    /* The maximum stack depth is one plus the number of variables.
    ** because a path may have nodes at all levels, including the
    ** constant level.
    */
    gen->stack.stack = ABC_ALLOC(DdNodePtr, nvars+1);
    if (gen->stack.stack == NULL) {
        zdd->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(gen->gen.cubes.cube);
        ABC_FREE(gen);
        return(NULL);
    }
    for (i = 0; i <= nvars; i++) gen->stack.stack[i] = NULL;

    /* Find the first path of the ZDD. */
    gen->stack.stack[gen->stack.sp] = f; gen->stack.sp++;

    while (1) {
        top = gen->stack.stack[gen->stack.sp-1];
        if (!cuddIsConstant(Cudd_Regular(top))) {
            /* Take the else branch first. */
            gen->gen.cubes.cube[Cudd_Regular(top)->index] = 0;
            next = cuddE(Cudd_Regular(top));
            gen->stack.stack[gen->stack.sp] = Cudd_Not(next); gen->stack.sp++;
        } else if (Cudd_Regular(top) == DD_ZERO(zdd)) {
            /* Backtrack. */
            while (1) {
                if (gen->stack.sp == 1) {
                    /* The current node has no predecessor. */
                    gen->status = CUDD_GEN_EMPTY;
                    gen->stack.sp--;
                    goto done;
                }
                prev = Cudd_Regular(gen->stack.stack[gen->stack.sp-2]);
                next = cuddT(prev);
                if (next != top) { /* follow the then branch next */
                    gen->gen.cubes.cube[prev->index] = 1;
                    gen->stack.stack[gen->stack.sp-1] = next;
                    break;
                }
                /* Pop the stack and try again. */
                gen->gen.cubes.cube[prev->index] = 2;
                gen->stack.sp--;
                top = gen->stack.stack[gen->stack.sp-1];
            }
        } else {
            gen->status = CUDD_GEN_NONEMPTY;
            gen->gen.cubes.value = cuddV(Cudd_Regular(top));
            goto done;
        }
    }

done:
    *path = gen->gen.cubes.cube;
    return(gen);

}